

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_TPIStream.cpp
# Opt level: O1

TPIStream * __thiscall PDB::TPIStream::operator=(TPIStream *this,TPIStream *other)

{
  void *pvVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int32_t iVar11;
  uint32_t uVar12;
  int32_t iVar13;
  uint32_t uVar14;
  
  if (this != other) {
    pvVar1 = (other->m_stream).m_data;
    puVar2 = (other->m_stream).m_blockIndices;
    uVar3 = (other->m_stream).m_size;
    uVar4 = (other->m_stream).m_blockSizeLog2;
    *(undefined8 *)((long)&(this->m_stream).m_blockIndices + 4) =
         *(undefined8 *)((long)&(other->m_stream).m_blockIndices + 4);
    (this->m_stream).m_size = uVar3;
    (this->m_stream).m_blockSizeLog2 = uVar4;
    (this->m_stream).m_data = pvVar1;
    (this->m_stream).m_blockIndices = puVar2;
    uVar3 = (other->m_header).headerSize;
    uVar4 = (other->m_header).typeIndexBegin;
    uVar5 = (other->m_header).typeIndexEnd;
    uVar6 = (other->m_header).typeRecordBytes;
    uVar7 = (other->m_header).hashStreamIndex;
    uVar8 = (other->m_header).hashAuxStreamIndex;
    uVar9 = (other->m_header).hashKeySize;
    uVar10 = (other->m_header).numHashBuckets;
    iVar11 = (other->m_header).hashValueBufferOffset;
    uVar12 = (other->m_header).hashValueBufferLength;
    iVar13 = (other->m_header).indexOffsetBufferOffset;
    uVar14 = (other->m_header).indexOffsetBufferLength;
    (this->m_header).version = (other->m_header).version;
    (this->m_header).headerSize = uVar3;
    (this->m_header).typeIndexBegin = uVar4;
    (this->m_header).typeIndexEnd = uVar5;
    (this->m_header).typeRecordBytes = uVar6;
    (this->m_header).hashStreamIndex = uVar7;
    (this->m_header).hashAuxStreamIndex = uVar8;
    (this->m_header).hashKeySize = uVar9;
    (this->m_header).numHashBuckets = uVar10;
    (this->m_header).hashValueBufferOffset = iVar11;
    (this->m_header).hashValueBufferLength = uVar12;
    (this->m_header).indexOffsetBufferOffset = iVar13;
    (this->m_header).indexOffsetBufferLength = uVar14;
    uVar3 = (other->m_header).hashAdjBufferLength;
    (this->m_header).hashAdjBufferOffset = (other->m_header).hashAdjBufferOffset;
    (this->m_header).hashAdjBufferLength = uVar3;
    this->m_recordCount = other->m_recordCount;
    other->m_recordCount = 0;
  }
  return this;
}

Assistant:

PDB::TPIStream& PDB::TPIStream::operator=(TPIStream&& other) PDB_NO_EXCEPT
{
	if (this != &other)
	{
		m_stream = PDB_MOVE(other.m_stream);
		m_header = PDB_MOVE(other.m_header);
		m_recordCount = PDB_MOVE(other.m_recordCount);

		other.m_recordCount = 0u;
	}

	return *this;
}